

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

int ccall_classify_struct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  uint uVar1;
  int in_ECX;
  CType *in_RDX;
  CTState *in_RSI;
  long *in_RDI;
  CTSize fofs;
  long *in_stack_ffffffffffffff38;
  uint local_a0;
  CTState *local_90;
  CTState *local_80;
  
  if (*(uint *)((long)&in_RSI->tab + 4) < 0x11) {
    while ((short)in_RSI->top != 0) {
      in_RSI = (CTState *)(*in_RDI + (ulong)(ushort)in_RSI->top * 0x10);
      uVar1 = in_ECX + *(int *)((long)&in_RSI->tab + 4);
      local_80 = in_RSI;
      if (*(uint *)&in_RSI->tab >> 0x1c == 9) {
        do {
          local_80 = (CTState *)(*in_RDI + (ulong)(*(uint *)&local_80->tab & 0xffff) * 0x10);
        } while (*(uint *)&local_80->tab >> 0x1c == 8);
        ccall_classify_ct(in_RSI,in_RDX,(int *)CONCAT44(in_ECX,uVar1),
                          (CTSize)((ulong)in_RDI >> 0x20));
        in_stack_ffffffffffffff38 = in_RDI;
      }
      else if (*(uint *)&in_RSI->tab >> 0x1c == 10) {
        (&in_RDX->info)[(int)(uint)(7 < uVar1)] = (&in_RDX->info)[(int)(uint)(7 < uVar1)] | 1;
      }
      else {
        local_90 = in_RSI;
        if (((ulong)in_RSI->tab & 0xf0ff0000) == 0x80030000) {
          do {
            local_90 = (CTState *)(*in_RDI + (ulong)(*(uint *)&local_90->tab & 0xffff) * 0x10);
          } while (*(uint *)&local_90->tab >> 0x1c == 8);
          ccall_classify_struct
                    (in_RSI,in_RDX,(int *)CONCAT44(in_ECX,uVar1),
                     (CTSize)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        }
      }
    }
    local_a0 = (in_RDX->info | in_RDX->size) & 4;
  }
  else {
    local_a0 = 4;
  }
  return local_a0;
}

Assistant:

static int ccall_classify_struct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ct->size > 16) return CCALL_RCL_MEM;  /* Too big, gets memory class. */
  while (ct->sib) {
    CTSize fofs;
    ct = ctype_get(cts, ct->sib);
    fofs = ofs+ct->size;
    if (ctype_isfield(ct->info))
      ccall_classify_ct(cts, ctype_rawchild(cts, ct), rcl, fofs);
    else if (ctype_isbitfield(ct->info))
      rcl[(fofs >= 8)] |= CCALL_RCL_INT;  /* NYI: unaligned bitfields? */
    else if (ctype_isxattrib(ct->info, CTA_SUBTYPE))
      ccall_classify_struct(cts, ctype_rawchild(cts, ct), rcl, fofs);
  }
  return ((rcl[0]|rcl[1]) & CCALL_RCL_MEM);  /* Memory class? */
}